

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,str *args)

{
  int iVar1;
  str *in_RDX;
  object local_20;
  
  iVar1 = PyGILState_Check();
  if (iVar1 != 0) {
    make_tuple<(pybind11::return_value_policy)1,pybind11::str&>((pybind11 *)&local_20,in_RDX);
    accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)args);
    simple_collector<(pybind11::return_value_policy)1>::call
              ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&local_20);
    object::~object(&local_20);
    return (object)(handle)this;
  }
  pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#ifndef NDEBUG
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}